

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

_Bool proxy_for_destination(SockAddr *addr,char *hostname,int port,Conf *conf)

{
  ushort *puVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ushort **ppuVar6;
  undefined4 in_register_00000014;
  byte *pbVar7;
  byte bVar8;
  char *__s2;
  char *__s1;
  long lVar9;
  size_t __n;
  long lVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  char hostip [64];
  
  if ((addr != (SockAddr *)0x0) && (_Var2 = sk_address_is_special_local(addr), _Var2)) {
    return false;
  }
  _Var2 = conf_get_bool((Conf *)CONCAT44(in_register_00000014,port),0xc);
  if (_Var2) {
    if (addr == (SockAddr *)0x0) goto LAB_0013fb21;
  }
  else {
    _Var2 = sk_hostname_is_local(hostname);
    if (_Var2) {
      return false;
    }
    if (addr == (SockAddr *)0x0) {
LAB_0013fb21:
      lVar10 = 0;
      goto LAB_0013fb29;
    }
    _Var2 = sk_address_is_local(addr);
    if (_Var2) {
      return false;
    }
  }
  sk_getaddr(addr,hostip,0x40);
  sVar4 = strlen(hostip);
  lVar10 = (long)(int)sVar4;
LAB_0013fb29:
  sVar4 = strlen(hostname);
  pcVar5 = conf_get_str((Conf *)CONCAT44(in_register_00000014,port),10);
  lVar12 = 0;
  do {
    lVar11 = (long)(int)lVar12;
    bVar13 = pcVar5[lVar11];
    bVar14 = bVar13 == 0;
    if (bVar14) {
      return true;
    }
    ppuVar6 = __ctype_b_loc();
    puVar1 = *ppuVar6;
    pbVar7 = (byte *)(pcVar5 + lVar11 + 1);
    lVar12 = -lVar11;
    while( true ) {
      lVar11 = lVar11 + 1;
      if (bVar13 == 0) {
        return true;
      }
      if ((bVar13 != 0x2c) && ((puVar1[bVar13] & 0x2000) == 0)) break;
      bVar13 = pcVar5[lVar11];
      lVar12 = lVar12 + -1;
      pbVar7 = pbVar7 + 1;
    }
    __s2 = pcVar5 + -lVar12;
    lVar12 = -lVar12;
    lVar9 = 0;
    bVar8 = bVar13;
    while ((bVar8 != 0 &&
           (((puVar1[bVar8] & 8) != 0 ||
            ((bVar8 < 0x2f && ((0x640000000000U >> ((ulong)bVar8 & 0x3f) & 1) != 0))))))) {
      bVar8 = pcVar5[lVar12 + 1];
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0x100000000;
      pbVar7 = pbVar7 + 1;
    }
    if (bVar13 == 0x2a) {
      __n = lVar9 + -0x100000000 >> 0x20;
      if ((addr != (SockAddr *)0x0) &&
         (iVar3 = strncasecmp(hostip + -__n + lVar10,pcVar5 + lVar11,__n), iVar3 == 0)) {
        return bVar14;
      }
      __s2 = pcVar5 + lVar11;
      __s1 = hostname + -__n + (long)(int)sVar4;
    }
    else {
      if (pcVar5[lVar12 + -1] == '*') {
        lVar9 = lVar9 + -0x100000000;
      }
      __n = lVar9 >> 0x20;
      __s1 = hostname;
      if ((addr != (SockAddr *)0x0) && (iVar3 = strncasecmp(hostip,__s2,__n), iVar3 == 0)) {
        return bVar14;
      }
    }
    iVar3 = strncasecmp(__s1,__s2,__n);
    if (iVar3 == 0) {
      return bVar14;
    }
    while (((bVar8 != 0 && (bVar8 != 0x2c)) && ((puVar1[bVar8] & 0x2000) == 0))) {
      lVar12 = lVar12 + 1;
      bVar8 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    }
  } while( true );
}

Assistant:

static bool proxy_for_destination(SockAddr *addr, const char *hostname,
                                  int port, Conf *conf)
{
    int s = 0, e = 0;
    char hostip[64];
    int hostip_len, hostname_len;
    const char *exclude_list;

    /*
     * Special local connections such as Unix-domain sockets
     * unconditionally cannot be proxied, even in proxy-localhost
     * mode. There just isn't any way to ask any known proxy type for
     * them.
     */
    if (addr && sk_address_is_special_local(addr))
        return false;                  /* do not proxy */

    /*
     * Check the host name and IP against the hard-coded
     * representations of `localhost'.
     */
    if (!conf_get_bool(conf, CONF_even_proxy_localhost) &&
        (sk_hostname_is_local(hostname) ||
         (addr && sk_address_is_local(addr))))
        return false;                  /* do not proxy */

    /* we want a string representation of the IP address for comparisons */
    if (addr) {
        sk_getaddr(addr, hostip, 64);
        hostip_len = strlen(hostip);
    } else
        hostip_len = 0;                /* placate gcc; shouldn't be required */

    hostname_len = strlen(hostname);

    exclude_list = conf_get_str(conf, CONF_proxy_exclude_list);

    /* now parse the exclude list, and see if either our IP
     * or hostname matches anything in it.
     */

    while (exclude_list[s]) {
        while (exclude_list[s] &&
               (isspace((unsigned char)exclude_list[s]) ||
                exclude_list[s] == ',')) s++;

        if (!exclude_list[s]) break;

        e = s;

        while (exclude_list[e] &&
               (isalnum((unsigned char)exclude_list[e]) ||
                exclude_list[e] == '-' ||
                exclude_list[e] == '.' ||
                exclude_list[e] == '*')) e++;

        if (exclude_list[s] == '*') {
            /* wildcard at beginning of entry */

            if ((addr && strnicmp(hostip + hostip_len - (e - s - 1),
                                  exclude_list + s + 1, e - s - 1) == 0) ||
                strnicmp(hostname + hostname_len - (e - s - 1),
                         exclude_list + s + 1, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else if (exclude_list[e-1] == '*') {
            /* wildcard at end of entry */

            if ((addr && strnicmp(hostip, exclude_list + s, e - s - 1) == 0) ||
                strnicmp(hostname, exclude_list + s, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else {
            /* no wildcard at either end, so let's try an absolute
             * match (ie. a specific IP)
             */

            if (addr && strnicmp(hostip, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
            if (strnicmp(hostname, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
        }

        s = e;

        /* Make sure we really have reached the next comma or end-of-string */
        while (exclude_list[s] &&
               !isspace((unsigned char)exclude_list[s]) &&
               exclude_list[s] != ',') s++;
    }

    /* no matches in the exclude list, so use the proxy */
    return true;
}